

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_dup_mem_arm
               (TCGContext_conflict *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz)

{
  TCGType_conflict type_00;
  TCGv_vec pTVar1;
  TCGv_i32 ret;
  TCGv_i64 pTVar2;
  TCGv_i64 ret_00;
  TCGv_i64 in1;
  TCGv_i64 in0;
  TCGv_vec in_2;
  int i;
  TCGv_i64 in_1;
  TCGv_i32 in;
  TCGv_vec t_vec;
  TCGType_conflict type;
  uint32_t maxsz_local;
  uint32_t oprsz_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict *tcg_ctx_local;
  
  check_size_align(oprsz,maxsz,dofs);
  if (vece < 4) {
    type_00 = choose_vector_type(tcg_ctx,(TCGOpcode *)0x0,vece,oprsz,false);
    if (type_00 == TCG_TYPE_I32) {
      if (vece < 3) {
        ret = tcg_temp_new_i32(tcg_ctx);
        if (vece == 0) {
          tcg_gen_ld8u_i32(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)aofs);
        }
        else if (vece == 1) {
          tcg_gen_ld16u_i32(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)aofs);
        }
        else {
          tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)aofs);
        }
        do_dup(tcg_ctx,vece,dofs,oprsz,maxsz,ret,(TCGv_i64)0x0,0);
        tcg_temp_free_i32(tcg_ctx,ret);
      }
      else {
        pTVar2 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_ld_i64_arm(tcg_ctx,pTVar2,tcg_ctx->cpu_env,(ulong)aofs);
        do_dup(tcg_ctx,vece,dofs,oprsz,maxsz,(TCGv_i32)0x0,pTVar2,0);
        tcg_temp_free_i64(tcg_ctx,pTVar2);
      }
    }
    else {
      pTVar1 = tcg_temp_new_vec_arm(tcg_ctx,type_00);
      tcg_gen_dup_mem_vec_arm(tcg_ctx,vece,pTVar1,tcg_ctx->cpu_env,(ulong)aofs);
      do_dup_store(tcg_ctx,type_00,dofs,oprsz,maxsz,pTVar1);
      tcg_temp_free_vec(tcg_ctx,pTVar1);
    }
  }
  else {
    if ((have_avx1_arm & 1U) == 0) {
      pTVar2 = tcg_temp_new_i64(tcg_ctx);
      ret_00 = tcg_temp_new_i64(tcg_ctx);
      tcg_gen_ld_i64_arm(tcg_ctx,pTVar2,tcg_ctx->cpu_env,(ulong)aofs);
      tcg_gen_ld_i64_arm(tcg_ctx,ret_00,tcg_ctx->cpu_env,(ulong)(aofs + 8));
      for (in_2._4_4_ = 0; in_2._4_4_ < oprsz; in_2._4_4_ = in_2._4_4_ + 0x10) {
        tcg_gen_st_i64_arm(tcg_ctx,pTVar2,tcg_ctx->cpu_env,(ulong)(dofs + in_2._4_4_));
        tcg_gen_st_i64_arm(tcg_ctx,ret_00,tcg_ctx->cpu_env,(ulong)(dofs + in_2._4_4_ + 8));
      }
      tcg_temp_free_i64(tcg_ctx,pTVar2);
      tcg_temp_free_i64(tcg_ctx,ret_00);
    }
    else {
      pTVar1 = tcg_temp_new_vec_arm(tcg_ctx,TCG_TYPE_V128);
      tcg_gen_ld_vec_arm(tcg_ctx,pTVar1,tcg_ctx->cpu_env,(ulong)aofs);
      for (in_2._4_4_ = 0; in_2._4_4_ < oprsz; in_2._4_4_ = in_2._4_4_ + 0x10) {
        tcg_gen_st_vec_arm(tcg_ctx,pTVar1,tcg_ctx->cpu_env,(ulong)(dofs + in_2._4_4_));
      }
      tcg_temp_free_vec(tcg_ctx,pTVar1);
    }
    if (oprsz < maxsz) {
      expand_clr(tcg_ctx,dofs + oprsz,maxsz - oprsz);
    }
  }
  return;
}

Assistant:

void tcg_gen_gvec_dup_mem(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                          uint32_t oprsz, uint32_t maxsz)
{
    check_size_align(oprsz, maxsz, dofs);
    if (vece <= MO_64) {
        TCGType type = choose_vector_type(tcg_ctx, NULL, vece, oprsz, 0);
        if (type != 0) {
            TCGv_vec t_vec = tcg_temp_new_vec(tcg_ctx, type);
            tcg_gen_dup_mem_vec(tcg_ctx, vece, t_vec, tcg_ctx->cpu_env, aofs);
            do_dup_store(tcg_ctx, type, dofs, oprsz, maxsz, t_vec);
            tcg_temp_free_vec(tcg_ctx, t_vec);
        } else if (vece <= MO_32) {
            TCGv_i32 in = tcg_temp_new_i32(tcg_ctx);
            switch (vece) {
            case MO_8:
                tcg_gen_ld8u_i32(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
                break;
            case MO_16:
                tcg_gen_ld16u_i32(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
                break;
            default:
                tcg_gen_ld_i32(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
                break;
            }
            do_dup(tcg_ctx, vece, dofs, oprsz, maxsz, in, NULL, 0);
            tcg_temp_free_i32(tcg_ctx, in);
        } else {
            TCGv_i64 in = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_ld_i64(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
            do_dup(tcg_ctx, vece, dofs, oprsz, maxsz, NULL, in, 0);
            tcg_temp_free_i64(tcg_ctx, in);
        }
    } else {
        /* 128-bit duplicate.  */
        /* ??? Dup to 256-bit vector.  */
        int i;

        tcg_debug_assert(vece == 4);
        tcg_debug_assert(oprsz >= 16);
        if (TCG_TARGET_HAS_v128) {
            TCGv_vec in = tcg_temp_new_vec(tcg_ctx, TCG_TYPE_V128);

            tcg_gen_ld_vec(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
            for (i = 0; i < oprsz; i += 16) {
                tcg_gen_st_vec(tcg_ctx, in, tcg_ctx->cpu_env, dofs + i);
            }
            tcg_temp_free_vec(tcg_ctx, in);
        } else {
            TCGv_i64 in0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 in1 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ld_i64(tcg_ctx, in0, tcg_ctx->cpu_env, aofs);
            tcg_gen_ld_i64(tcg_ctx, in1, tcg_ctx->cpu_env, aofs + 8);
            for (i = 0; i < oprsz; i += 16) {
                tcg_gen_st_i64(tcg_ctx, in0, tcg_ctx->cpu_env, dofs + i);
                tcg_gen_st_i64(tcg_ctx, in1, tcg_ctx->cpu_env, dofs + i + 8);
            }
            tcg_temp_free_i64(tcg_ctx, in0);
            tcg_temp_free_i64(tcg_ctx, in1);
        }
        if (oprsz < maxsz) {
            expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
        }
    }
}